

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::PaddedSobolSampler::Get2D(PaddedSobolSampler *this)

{
  span<const_unsigned_int> C;
  span<const_unsigned_int> C_00;
  int textureIndex;
  ulong uVar1;
  BasicOptions *pBVar2;
  uint64_t uVar3;
  uint32_t *in_RDI;
  float fVar4;
  Float FVar5;
  int dim;
  int index;
  uint64_t hash;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff90;
  uint32_t in_stack_ffffffffffffffb0;
  CranleyPattersonRotator in_stack_ffffffffffffffb4;
  PaddedSobolSampler *in_stack_ffffffffffffffb8;
  span<const_unsigned_int> in_stack_ffffffffffffffc0;
  Tuple2<pbrt::Point2,_float> local_8;
  
  uVar1 = (long)(int)in_RDI[2] << 0x30 ^ (long)(int)in_RDI[3] << 0x20 ^ (long)(int)in_RDI[5] << 0x10
  ;
  pBVar2 = GetOptions();
  uVar3 = MixBits(uVar1 ^ (long)pBVar2->seed);
  textureIndex = PermutationElement(in_RDI[4],*in_RDI,(uint32_t)uVar3);
  in_RDI[5] = in_RDI[5] + 2;
  if (in_RDI[1] == 1) {
    pstd::span<unsigned_int_const>::span<32ul>
              ((span<const_unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (uint (*) [32])CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    fVar4 = BlueNoise(textureIndex,in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c);
    CranleyPattersonRotator::CranleyPattersonRotator
              ((CranleyPattersonRotator *)&stack0xffffffffffffffcc,fVar4);
    C.n = in_stack_ffffffffffffff90;
    C.ptr = in_RDI;
    SampleGeneratorMatrix<pbrt::CranleyPattersonRotator>
              (C,(uint32_t)uVar1,(CranleyPattersonRotator)(uint32_t)(uVar1 >> 0x20));
    pstd::span<unsigned_int_const>::span<32ul>
              ((span<const_unsigned_int> *)CONCAT44(textureIndex,in_stack_ffffffffffffff70),
               (uint (*) [32])CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    fVar4 = BlueNoise(textureIndex,in_stack_ffffffffffffff70,(int)in_stack_ffffffffffffff6c);
    CranleyPattersonRotator::CranleyPattersonRotator
              ((CranleyPattersonRotator *)&stack0xffffffffffffffb4,fVar4);
    C_00.n = in_stack_ffffffffffffff90;
    C_00.ptr = in_RDI;
    SampleGeneratorMatrix<pbrt::CranleyPattersonRotator>
              (C_00,(uint32_t)uVar1,(CranleyPattersonRotator)(uint32_t)(uVar1 >> 0x20));
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(textureIndex,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
  }
  else {
    pstd::span<unsigned_int_const>::span<32ul>
              ((span<const_unsigned_int> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (uint (*) [32])CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    FVar5 = generateSample(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffb4.offset,in_stack_ffffffffffffffb0);
    pstd::span<unsigned_int_const>::span<32ul>
              ((span<const_unsigned_int> *)CONCAT44(in_stack_ffffffffffffff74,FVar5),
               (uint (*) [32])CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    generateSample(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffb4.offset,in_stack_ffffffffffffffb0);
    Point2<float>::Point2
              ((Point2<float> *)CONCAT44(in_stack_ffffffffffffff74,FVar5),in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff68);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Get permuted index for current pixel sample
        uint64_t hash = MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                                ((uint64_t)dimension << 16) ^ GetOptions().seed);
        int index = PermutationElement(sampleIndex, samplesPerPixel, hash);

        int dim = dimension;
        dimension += 2;
        if (randomizeStrategy == RandomizeStrategy::CranleyPatterson)
            // Return 2D sample randomized with Cranley-Patterson rotation
            return {SampleGeneratorMatrix(
                        CSobol[0], index,
                        CranleyPattersonRotator(BlueNoise(dim, pixel.x, pixel.y))),
                    SampleGeneratorMatrix(
                        CSobol[1], index,
                        CranleyPattersonRotator(BlueNoise(dim + 1, pixel.x, pixel.y)))};

        else
            return {generateSample(CSobol[0], index, hash >> 8),
                    generateSample(CSobol[1], index, hash >> 32)};
    }